

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

bool tinyexr::DecompressPiz
               (uchar *outPtr,uchar *inPtr,size_t tmpBufSize,int num_channels,
               EXRChannelInfo *channels,int data_width,int num_lines)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  unsigned_short *puVar4;
  int iVar5;
  reference pvVar6;
  reference pvVar7;
  size_type sVar8;
  vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> *this;
  int in_ECX;
  undefined8 in_RDX;
  ushort *in_RSI;
  void *in_RDI;
  long in_R8;
  int in_R9D;
  int in_stack_00000008;
  int n;
  PIZChannelData *cd_1;
  size_t i_2;
  int y;
  int j;
  PIZChannelData *cd;
  size_t i_1;
  int pixelSize;
  EXRChannelInfo *chan;
  size_t i;
  unsigned_short *tmpBufferEnd;
  vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> channelData;
  vector<unsigned_short,_std::allocator<unsigned_short>_> tmpBuffer;
  int length;
  unsigned_short maxValue;
  unsigned_short lut [65536];
  uchar *ptr;
  unsigned_short maxNonZero;
  unsigned_short minNonZero;
  uchar bitmap [8192];
  size_type in_stack_fffffffffffdde78;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_fffffffffffdde80;
  size_type sVar9;
  allocator_type *in_stack_fffffffffffdde90;
  size_type in_stack_fffffffffffdde98;
  vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
  *in_stack_fffffffffffddea0;
  unsigned_short *lut_00;
  undefined8 uVar10;
  undefined1 *puVar11;
  undefined4 in_stack_fffffffffffddf10;
  undefined4 in_stack_fffffffffffddf14;
  size_type sStack_220e0;
  int iStack_220d8;
  int iStack_220d4;
  size_type sStack_220c8;
  int in_stack_fffffffffffddf44;
  int iVar12;
  unsigned_short *in_stack_fffffffffffddf48;
  undefined8 in_stack_fffffffffffddf50;
  ulong __n;
  char *in_stack_fffffffffffddf58;
  reference pvVar13;
  vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> vStack_22098;
  undefined1 auStack_22069 [25];
  undefined4 uStack_22050;
  unsigned_short uStack_2204a;
  unsigned_short auStack_22048 [65536];
  ushort *local_2048;
  uchar local_2038 [8196];
  int local_34;
  long local_30;
  int local_24;
  undefined8 local_20;
  ushort *local_18;
  void *local_10;
  byte local_1;
  
  iVar12 = (int)((ulong)in_stack_fffffffffffddf50 >> 0x20);
  local_34 = in_R9D;
  local_30 = in_R8;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(local_2038,0,0x2000);
  uVar1 = *local_18;
  uVar2 = local_18[1];
  local_2048 = local_18 + 2;
  if (uVar2 < 0x2000) {
    if (uVar1 <= uVar2) {
      memcpy(local_2038 + (int)(uint)uVar1,local_2048,(long)(int)(((uint)uVar2 - (uint)uVar1) + 1));
      local_2048 = (ushort *)((long)local_2048 + (long)(int)(((uint)uVar2 - (uint)uVar1) + 1));
    }
    lut_00 = auStack_22048;
    memset(lut_00,0,0x20000);
    uStack_2204a = reverseLutFromBitmap(local_2038,lut_00);
    uStack_22050 = *(undefined4 *)local_2048;
    puVar11 = auStack_22069;
    uVar10 = local_20;
    std::allocator<unsigned_short>::allocator((allocator<unsigned_short> *)0x158054);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_fffffffffffddea0,
               in_stack_fffffffffffdde98,(allocator_type *)in_stack_fffffffffffdde90);
    std::allocator<unsigned_short>::~allocator((allocator<unsigned_short> *)0x158080);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at
              (in_stack_fffffffffffdde80,in_stack_fffffffffffdde78);
    hufUncompress(in_stack_fffffffffffddf58,iVar12,in_stack_fffffffffffddf48,
                  in_stack_fffffffffffddf44);
    std::allocator<tinyexr::PIZChannelData>::allocator
              ((allocator<tinyexr::PIZChannelData> *)0x1580eb);
    std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::vector
              (in_stack_fffffffffffddea0,in_stack_fffffffffffdde98,in_stack_fffffffffffdde90);
    std::allocator<tinyexr::PIZChannelData>::~allocator
              ((allocator<tinyexr::PIZChannelData> *)0x158111);
    pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at
                       (in_stack_fffffffffffdde80,in_stack_fffffffffffdde78);
    for (__n = 0; __n < (ulong)(long)local_24; __n = __n + 1) {
      iVar12 = 4;
      if (*(int *)(local_30 + __n * 0x110 + 0x100) == 1) {
        iVar12 = 2;
      }
      pvVar13 = pvVar6;
      pvVar7 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::
               operator[](&vStack_22098,__n);
      pvVar7->start = pvVar6;
      pvVar7 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::
               operator[](&vStack_22098,__n);
      puVar4 = pvVar7->start;
      pvVar7 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::
               operator[](&vStack_22098,__n);
      iVar5 = local_34;
      pvVar7->end = puVar4;
      pvVar7 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::
               operator[](&vStack_22098,__n);
      iVar3 = in_stack_00000008;
      pvVar7->nx = iVar5;
      pvVar7 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::
               operator[](&vStack_22098,__n);
      pvVar7->ny = iVar3;
      pvVar7 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::
               operator[](&vStack_22098,__n);
      pvVar7->size = (int)((ulong)(long)iVar12 >> 1);
      pvVar7 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::
               operator[](&vStack_22098,__n);
      iVar12 = pvVar7->nx;
      pvVar7 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::
               operator[](&vStack_22098,__n);
      iVar3 = pvVar7->ny;
      pvVar7 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::
               operator[](&vStack_22098,__n);
      pvVar6 = pvVar13 + iVar12 * iVar3 * pvVar7->size;
    }
    sStack_220c8 = 0;
    while( true ) {
      sVar9 = sStack_220c8;
      sVar8 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::size
                        (&vStack_22098);
      if (sVar8 <= sVar9) break;
      pvVar7 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::
               operator[](&vStack_22098,sStack_220c8);
      for (iStack_220d4 = 0; iStack_220d4 < pvVar7->size; iStack_220d4 = iStack_220d4 + 1) {
        wav2Decode((unsigned_short *)CONCAT44(in_stack_fffffffffffddf14,in_stack_fffffffffffddf10),
                   (int)((ulong)puVar11 >> 0x20),(int)puVar11,(int)((ulong)uVar10 >> 0x20),
                   (int)uVar10,(unsigned_short)((ulong)lut_00 >> 0x30));
      }
      sStack_220c8 = sStack_220c8 + 1;
    }
    this = (vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> *)
           std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at
                     (in_stack_fffffffffffdde80,in_stack_fffffffffffdde78);
    applyLut(auStack_22048,(unsigned_short *)this,(int)local_20);
    for (iStack_220d8 = 0; iStack_220d8 < in_stack_00000008; iStack_220d8 = iStack_220d8 + 1) {
      sStack_220e0 = 0;
      while( true ) {
        sVar9 = sStack_220e0;
        sVar8 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::size
                          (&vStack_22098);
        if (sVar8 <= sVar9) break;
        pvVar7 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::
                 operator[](&vStack_22098,sStack_220e0);
        iVar12 = pvVar7->nx * pvVar7->size;
        memcpy(local_10,pvVar7->end,(long)iVar12 << 1);
        local_10 = (void *)((long)iVar12 * 2 + (long)local_10);
        pvVar7->end = pvVar7->end + iVar12;
        sStack_220e0 = sStack_220e0 + 1;
      }
    }
    local_1 = 1;
    std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::~vector(this);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)this);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool DecompressPiz(unsigned char *outPtr, const unsigned char *inPtr,
                   size_t tmpBufSize, int num_channels,
                   const EXRChannelInfo *channels, int data_width,
                   int num_lines) {
  unsigned char bitmap[BITMAP_SIZE];
  unsigned short minNonZero;
  unsigned short maxNonZero;

#if !MINIZ_LITTLE_ENDIAN
  // @todo { PIZ compression on BigEndian architecture. }
  assert(0);
  return false;
#endif

  memset(bitmap, 0, BITMAP_SIZE);

  const unsigned char *ptr = inPtr;
  minNonZero = *(reinterpret_cast<const unsigned short *>(ptr));
  maxNonZero = *(reinterpret_cast<const unsigned short *>(ptr + 2));
  ptr += 4;

  if (maxNonZero >= BITMAP_SIZE) {
    return false;
  }

  if (minNonZero <= maxNonZero) {
    memcpy((char *)&bitmap[0] + minNonZero, ptr, maxNonZero - minNonZero + 1);
    ptr += maxNonZero - minNonZero + 1;
  }

  unsigned short lut[USHORT_RANGE];
  memset(lut, 0, sizeof(unsigned short) * USHORT_RANGE);
  unsigned short maxValue = reverseLutFromBitmap(bitmap, lut);

  //
  // Huffman decoding
  //

  int length;

  length = *(reinterpret_cast<const int *>(ptr));
  ptr += sizeof(int);

  std::vector<unsigned short> tmpBuffer(tmpBufSize);
  hufUncompress(reinterpret_cast<const char *>(ptr), length, &tmpBuffer.at(0),
                tmpBufSize);

  //
  // Wavelet decoding
  //

  std::vector<PIZChannelData> channelData(num_channels);

  unsigned short *tmpBufferEnd = &tmpBuffer.at(0);

  for (size_t i = 0; i < static_cast<size_t>(num_channels); ++i) {
    const EXRChannelInfo &chan = channels[i];

    int pixelSize = sizeof(int);  // UINT and FLOAT
    if (chan.pixel_type == TINYEXR_PIXELTYPE_HALF) {
      pixelSize = sizeof(short);
    }

    channelData[i].start = tmpBufferEnd;
    channelData[i].end = channelData[i].start;
    channelData[i].nx = data_width;
    channelData[i].ny = num_lines;
    // channelData[i].ys = 1;
    channelData[i].size = pixelSize / sizeof(short);

    tmpBufferEnd += channelData[i].nx * channelData[i].ny * channelData[i].size;
  }

  for (size_t i = 0; i < channelData.size(); ++i) {
    PIZChannelData &cd = channelData[i];

    for (int j = 0; j < cd.size; ++j) {
      wav2Decode(cd.start + j, cd.nx, cd.size, cd.ny, cd.nx * cd.size,
                 maxValue);
    }
  }

  //
  // Expand the pixel data to their original range
  //

  applyLut(lut, &tmpBuffer.at(0), tmpBufSize);

  for (int y = 0; y < num_lines; y++) {
    for (size_t i = 0; i < channelData.size(); ++i) {
      PIZChannelData &cd = channelData[i];

      // if (modp (y, cd.ys) != 0)
      //    continue;

      int n = cd.nx * cd.size;
      memcpy(outPtr, cd.end, n * sizeof(unsigned short));
      outPtr += n * sizeof(unsigned short);
      cd.end += n;
    }
  }

  return true;
}